

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::GraphicsRobustAccessPass::InsertInst
          (GraphicsRobustAccessPass *this,Instruction *where_inst,Op opcode,uint32_t type_id,
          uint32_t result_id,OperandList *operands)

{
  Instruction *pIVar1;
  IRContext *pIVar2;
  DefUseManager *this_00;
  BasicBlock *block;
  BasicBlock *basic_block;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_40;
  Instruction *local_38;
  Instruction *result;
  OperandList *operands_local;
  uint32_t local_20;
  uint32_t result_id_local;
  uint32_t type_id_local;
  Op opcode_local;
  Instruction *where_inst_local;
  GraphicsRobustAccessPass *this_local;
  
  (this->super_Pass).field_0x34 = 1;
  result = (Instruction *)operands;
  operands_local._4_4_ = result_id;
  local_20 = type_id;
  result_id_local = opcode;
  _type_id_local = where_inst;
  where_inst_local = (Instruction *)this;
  basic_block = (BasicBlock *)Pass::context(&this->super_Pass);
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op&,unsigned_int&,unsigned_int&,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>const&>
            ((spvtools *)&local_40,(IRContext **)&basic_block,&result_id_local,&local_20,
             (uint *)((long)&operands_local + 4),
             (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)result);
  pIVar1 = Instruction::InsertBefore(where_inst,&local_40);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_40);
  local_38 = pIVar1;
  pIVar2 = Pass::context(&this->super_Pass);
  this_00 = IRContext::get_def_use_mgr(pIVar2);
  analysis::DefUseManager::AnalyzeInstDefUse(this_00,local_38);
  pIVar2 = Pass::context(&this->super_Pass);
  block = IRContext::get_instr_block(pIVar2,_type_id_local);
  pIVar2 = Pass::context(&this->super_Pass);
  IRContext::set_instr_block(pIVar2,local_38,block);
  return local_38;
}

Assistant:

opt::Instruction* GraphicsRobustAccessPass::InsertInst(
    opt::Instruction* where_inst, spv::Op opcode, uint32_t type_id,
    uint32_t result_id, const Instruction::OperandList& operands) {
  module_status_.modified = true;
  auto* result = where_inst->InsertBefore(
      MakeUnique<Instruction>(context(), opcode, type_id, result_id, operands));
  context()->get_def_use_mgr()->AnalyzeInstDefUse(result);
  auto* basic_block = context()->get_instr_block(where_inst);
  context()->set_instr_block(result, basic_block);
  return result;
}